

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

char * ImParseFormatTrimDecorations(char *fmt,char *buf,size_t buf_size)

{
  char *fmt_00;
  char *pcVar1;
  char *count;
  
  fmt_00 = ImParseFormatFindStart(fmt);
  if ((*fmt_00 == '%') && (pcVar1 = ImParseFormatFindEnd(fmt_00), fmt = fmt_00, *pcVar1 != '\0')) {
    count = pcVar1 + (1 - (long)fmt_00);
    if (buf_size <= pcVar1 + (1 - (long)fmt_00)) {
      count = (char *)buf_size;
    }
    ImStrncpy(buf,fmt_00,(size_t)count);
    fmt = buf;
  }
  return fmt;
}

Assistant:

const char* ImParseFormatTrimDecorations(const char* fmt, char* buf, size_t buf_size)
{
    const char* fmt_start = ImParseFormatFindStart(fmt);
    if (fmt_start[0] != '%')
        return fmt;
    const char* fmt_end = ImParseFormatFindEnd(fmt_start);
    if (fmt_end[0] == 0) // If we only have leading decoration, we don't need to copy the data.
        return fmt_start;
    ImStrncpy(buf, fmt_start, ImMin((size_t)(fmt_end - fmt_start) + 1, buf_size));
    return buf;
}